

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_fileWatcher.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  char cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  fileWatcher *this;
  thread watch_t;
  shared_ptr<wmj::fileWatcher::fileWatcher> fw;
  string file_name;
  long local_80;
  fileWatcher *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"./build/test.txt","");
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((ulong)&local_48,0,(char *)local_48._M_string_length,(ulong)__s);
  }
  local_78 = (fileWatcher *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00104c90;
  this = (fileWatcher *)(p_Var2 + 1);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/test/example_fileWatcher.cpp:32:74)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/test/example_fileWatcher.cpp:32:74)>
             ::_M_manager;
  wmj::fileWatcher::fileWatcher::fileWatcher(this,&local_48,(function<void_()> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  local_78 = this;
  p_Stack_70 = p_Var2;
  wmj::fileWatcher::fileWatcher::startWatch(this);
  local_80 = 0;
  local_68._M_unused._M_object = operator_new(0x10);
  *(undefined ***)local_68._M_unused._0_8_ = &PTR___State_00104d50;
  *(fileWatcher ***)((long)local_68._M_unused._0_8_ + 8) = &local_78;
  std::thread::_M_start_thread(&local_80,&local_68,0);
  if ((long *)local_68._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_68._M_unused._M_object + 8))();
  }
  cVar1 = getch();
  if (cVar1 != 'q' && '\0' < cVar1) {
    do {
      if (cVar1 == 'p') {
        wmj::fileWatcher::fileWatcher::stopWatch(local_78);
      }
      else if (cVar1 == 'o') {
        wmj::fileWatcher::fileWatcher::startWatch(local_78);
      }
      cVar1 = getch();
    } while (('\0' < cVar1) && (cVar1 != 'q'));
  }
  p_Var2 = p_Stack_70;
  local_78 = (fileWatcher *)0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::thread::join();
  if (local_80 != 0) {
    std::terminate();
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc,char **argv) {
    std::string file_name = "./build/test.txt";
    if (argc>=2){
        file_name = argv[1];
    }
    // 创建文件监视对象，设置回调函数
    auto fw = std::make_shared<wmj::fileWatcher::fileWatcher>(file_name, []() {
        std::cout << "file change" << std::endl;
    });
    // 开始文件监视
    fw->startWatch();
    // 建立文件监视进程
    std::thread watch_t([&fw]() {
        fw->run();
    });
    char a;
    while((a = getch()) > 0) {
        // 按q结束程序
        if(a == 'q') {
            break;
        }
        // 按o开始文件监视
        if(a == 'o') {
            fw->startWatch();
        }
        // 按p结束文件监视
        if(a == 'p') {
            fw->stopWatch();
        }
    }
    // 释放资源停止run函数
    fw.reset();
    // 等待文件监视进程结束
    watch_t.join();
    return 0;
}